

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O2

int mp_compare_uint(char *data_a,char *data_b)

{
  uint8_t type;
  uint8_t type_00;
  uint uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong *local_20;
  ulong *local_18;
  
  type = *data_a;
  local_18 = (ulong *)(data_a + 1);
  type_00 = *data_b;
  local_20 = (ulong *)(data_b + 1);
  if (type == type_00) {
    switch(type) {
    case 0xcc:
      uVar4 = (ulong)(byte)*local_18;
      uVar5 = (ulong)(byte)*local_20;
      break;
    case 0xcd:
      uVar4 = (ulong)(ushort)((ushort)*local_18 << 8 | (ushort)*local_18 >> 8);
      uVar5 = (ulong)(ushort)((ushort)*local_20 << 8 | (ushort)*local_20 >> 8);
      break;
    case 0xce:
      uVar1 = (uint)*local_18;
      uVar4 = (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                     uVar1 << 0x18);
      uVar1 = (uint)*local_20;
      uVar5 = (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                     uVar1 << 0x18);
      break;
    case 0xcf:
      uVar5 = *local_18;
      uVar4 = uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18
              | (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18
              | (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
      uVar5 = *local_20;
      uVar5 = uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18
              | (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18
              | (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
      break;
    default:
      return 0;
    }
    uVar1 = 0xffffffff;
    if (uVar5 <= uVar4) {
      uVar1 = (uint)(uVar5 < uVar4);
    }
  }
  else {
    uVar2 = mp_decode_uint_data(type,(char **)&local_18);
    uVar3 = mp_decode_uint_data(type_00,(char **)&local_20);
    uVar1 = 0xffffffff;
    if (uVar3 <= uVar2) {
      uVar1 = (uint)(uVar3 < uVar2);
    }
  }
  return uVar1;
}

Assistant:

MP_IMPL int
mp_compare_uint(const char *data_a, const char *data_b)
{
	uint8_t ca = mp_load_u8(&data_a);
	uint8_t cb = mp_load_u8(&data_b);
	uint64_t a, b;
	if (ca != cb) {
		a = mp_decode_uint_data(ca, &data_a);
		b = mp_decode_uint_data(cb, &data_b);
		return a < b ? -1 : a > b;
	}
	switch (ca) {
	case 0xcc:
		a = mp_load_u8(&data_a);
		b = mp_load_u8(&data_b);
		break;
	case 0xcd:
		a = mp_load_u16(&data_a);
		b = mp_load_u16(&data_b);
		break;
	case 0xce:
		a = mp_load_u32(&data_a);
		b = mp_load_u32(&data_b);
		break;
	case 0xcf:
		a = mp_load_u64(&data_a);
		b = mp_load_u64(&data_b);
		break;
	default:
		return 0;
	}
	return a < b ? -1 : a > b;
}